

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

void pystring::split(string *str,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *result,string *sep,int maxsplit)

{
  char cVar1;
  bool bVar2;
  string *psVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  __type local_c1;
  value_type local_c0;
  value_type local_90;
  byte local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long local_48;
  size_type n;
  size_type len;
  size_type j;
  size_type i;
  string *psStack_20;
  int maxsplit_local;
  string *sep_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  string *str_local;
  
  i._4_4_ = maxsplit;
  psStack_20 = sep;
  sep_local = (string *)result;
  result_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)str;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(result);
  if (i._4_4_ < 0) {
    i._4_4_ = 0x7fffffff;
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 0) {
    anon_unknown_2::split_whitespace
              ((string *)result_local,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)sep_local,i._4_4_);
  }
  else {
    n = std::__cxx11::string::size();
    local_48 = std::__cxx11::string::size();
    len = 0;
    j = 0;
    while (j + local_48 <= n) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)result_local);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psStack_20);
      local_69 = 0;
      local_c1 = false;
      if (cVar1 == *pcVar5) {
        std::__cxx11::string::substr((ulong)&local_68,(ulong)result_local);
        local_69 = 1;
        local_c1 = std::operator==(&local_68,psStack_20);
      }
      if ((local_69 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_68);
      }
      psVar3 = sep_local;
      if (local_c1 == false) {
        j = j + 1;
      }
      else {
        iVar6 = i._4_4_ + -1;
        bVar2 = i._4_4_ < 1;
        i._4_4_ = iVar6;
        if (bVar2) break;
        std::__cxx11::string::substr((ulong)&local_90,(ulong)result_local);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)psVar3,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        len = j + local_48;
        j = len;
      }
    }
    psVar3 = sep_local;
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)result_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)psVar3,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return;
}

Assistant:

void split( const std::string & str, std::vector< std::string > & result, const std::string & sep, int maxsplit )
    {
        result.clear();

        if ( maxsplit < 0 ) maxsplit = MAX_32BIT_INT;//result.max_size();


        if ( sep.size() == 0 )
        {
            split_whitespace( str, result, maxsplit );
            return;
        }

        std::string::size_type i,j, len = str.size(), n = sep.size();

        i = j = 0;

        while ( i+n <= len )
        {
            if ( str[i] == sep[0] && str.substr( i, n ) == sep )
            {
                if ( maxsplit-- <= 0 ) break;

                result.push_back( str.substr( j, i - j ) );
                i = j = i + n;
            }
            else
            {
                i++;
            }
        }

        result.push_back( str.substr( j, len-j ) );
    }